

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
::TestBody(InsertHint<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_union_8_1_a8a14541_for_iterator_1 aVar3;
  mt19937_64 *__urng;
  slot_type ptVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  T val;
  TypeParam m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  Message local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [8];
  anon_union_8_1_a8a14541_for_iterator_1 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  AssertHelper local_78;
  result_type_conflict local_6c;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_68;
  
  local_68.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_6c = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_68,__urng,(param_type *)&local_68);
  local_68.size_ = 0;
  local_68.capacity_ = 0;
  local_68.ctrl_ = (ctrl_t *)0x0;
  local_68.slots_ = (slot_type *)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Tuple_impl<3UL,_phmap::priv::Alloc<int>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<int>,_false>._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<int>,_false>)(Alloc<int>)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_6c;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_decomposable<int,int_const&>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
              *)local_98,
             (raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_68,&local_6c,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_6c);
  aVar3 = local_90;
  local_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       ((ctrl_t *)CONCAT71(local_98._1_7_,local_98[0]) != local_68.ctrl_ + local_68.capacity_);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_a8,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3b,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]) != local_98 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]),
                      local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<int,int>((internal *)local_98,"val","*it",&local_6c,*aVar3.slot_);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message(&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ptVar4 = (slot_type)0x21fe8f;
    }
    else {
      ptVar4 = *local_90.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3c,(char *)ptVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((long *)CONCAT71(local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_98 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_
                );
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_6c;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::emplace_decomposable<int,int_const&>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::iterator,_bool>
              *)local_98,
             (raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_68,&local_6c,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),&local_6c);
  aVar3 = local_90;
  local_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       ((ctrl_t *)CONCAT71(local_98._1_7_,local_98[0]) != local_68.ctrl_ + local_68.capacity_);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_a8,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3e,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]) != local_98 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]),
                      local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<int,int>((internal *)local_98,"val","*it",&local_6c,*aVar3.slot_);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message(&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ptVar4 = (slot_type)0x21fe8f;
    }
    else {
      ptVar4 = *local_90.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3f,(char *)ptVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((long *)CONCAT71(local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_98 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_
                );
  }
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::destroy_slots(&local_68);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  it = m.insert(it, val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}